

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublylinkedlist.c
# Opt level: O3

void DList_AppendTailList(PDLIST_ENTRY ListHead,PDLIST_ENTRY ListToAppend)

{
  DLIST_ENTRY_TAG *pDVar1;
  DLIST_ENTRY_TAG *pDVar2;
  
  pDVar1 = ListHead->Blink;
  pDVar1->Flink = ListToAppend;
  pDVar2 = ListToAppend->Blink;
  ListHead->Blink = pDVar2;
  pDVar2->Flink = ListHead;
  ListToAppend->Blink = pDVar1;
  return;
}

Assistant:

void
DList_AppendTailList(
    PDLIST_ENTRY ListHead,
    PDLIST_ENTRY ListToAppend
)
{
    /* Codes_SRS_DLIST_06_007: [DList_AppendTailList shall place the list defined by listToAppend at the end of the list defined by the listHead parameter.] */
    PDLIST_ENTRY ListEnd = ListHead->Blink;

    ListHead->Blink->Flink = ListToAppend;
    ListHead->Blink = ListToAppend->Blink;
    ListToAppend->Blink->Flink = ListHead;
    ListToAppend->Blink = ListEnd;
    return;
}